

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

string * __thiscall
cxxopts::values::abstract_value<unsigned_short>::get_implicit_value_abi_cxx11_
          (string *__return_storage_ptr__,abstract_value<unsigned_short> *this)

{
  abstract_value<unsigned_short> *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_implicit_value);
  return __return_storage_ptr__;
}

Assistant:

std::string
      get_implicit_value() const override
      {
        return m_implicit_value;
      }